

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
::
emplace_decomposable<unsigned_int,std::piecewise_construct_t_const&,std::tuple<unsigned_int_const&>,std::tuple<unsigned_int_const&>>
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          *this,uint *key,size_t hashval,piecewise_construct_t *args,
          tuple<const_unsigned_int_&> *args_1,tuple<const_unsigned_int_&> *args_2)

{
  uint *puVar1;
  long lVar2;
  size_t i;
  ctrl_t *pcVar3;
  bool bVar4;
  
  i = raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::_find_key<unsigned_int>
                ((raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)this,key,hashval);
  bVar4 = i == 0xffffffffffffffff;
  if (bVar4) {
    i = raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::prepare_insert((raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)this,hashval);
    lVar2 = *(long *)(this + 8);
    puVar1 = (args_2->super__Tuple_impl<0UL,_const_unsigned_int_&>).
             super__Head_base<0UL,_const_unsigned_int_&,_false>._M_head_impl;
    *(uint *)(lVar2 + i * 8) =
         *(args_1->super__Tuple_impl<0UL,_const_unsigned_int_&>).
          super__Head_base<0UL,_const_unsigned_int_&,_false>._M_head_impl;
    *(uint *)(lVar2 + 4 + i * 8) = *puVar1;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                *)this,i,(byte)hashval & 0x7f);
    pcVar3 = (ctrl_t *)(i + *(long *)this);
  }
  else {
    pcVar3 = (ctrl_t *)(*(long *)this + i);
  }
  lVar2 = *(long *)(this + 8);
  (__return_storage_ptr__->first).ctrl_ = pcVar3;
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(i * 8 + lVar2);
  __return_storage_ptr__->second = bVar4;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval, 
                                                   Args&&... args)
    {
        size_t offset = _find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = prepare_insert(hashval);
            emplace_at(offset, std::forward<Args>(args)...);
            this->set_ctrl(offset, H2(hashval));
            return {iterator_at(offset), true};
        }
        return {iterator_at(offset), false};
    }